

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O3

_Bool project_o(source origin,wchar_t r,loc_conflict grid,wchar_t dam,wchar_t typ,
               object *protected_obj)

{
  project_object_handler_f p_Var1;
  object *poVar2;
  chunk_conflict *c;
  undefined2 uVar3;
  _Bool _Var4;
  object *obj;
  monster_conflict *mon;
  char *pcVar5;
  byte bVar6;
  char o_name [80];
  project_object_handler_context_t local_c8;
  char local_88 [88];
  
  obj = square_object(cave,(loc)grid);
  if (obj == (object *)0x0) {
    local_c8.obvious = false;
  }
  else {
    p_Var1 = object_handlers[typ];
    local_c8.obvious = false;
    do {
      poVar2 = obj->next;
      local_c8.do_kill = false;
      local_c8.ignore = false;
      local_c8.note_kill = (char *)0x0;
      bVar6 = local_c8.obvious;
      if (((typ != L'>') &&
          (local_c8.origin.what = origin.what, local_c8.origin.which = origin.which, local_c8.r = r,
          local_c8.grid = (loc)grid, local_c8.dam = dam, local_c8.type = typ, local_c8.obj = obj,
          (*p_Var1)(&local_c8), pcVar5 = local_c8.note_kill, uVar3 = local_c8._49_2_,
          bVar6 = local_c8.obvious, obj != protected_obj)) && ((local_c8._49_2_ & 1) != 0)) {
        if (((obj->known != (object *)0x0) && (_Var4 = ignore_item_ok(player,obj), !_Var4)) &&
           (_Var4 = square_isseen(cave,(loc)grid), _Var4)) {
          object_desc(local_88,0x50,obj,0,player);
          bVar6 = 1;
        }
        c = cave;
        if ((obj->artifact == (artifact *)0x0) && ((uVar3 & 0x100) == 0)) {
          if (obj->mimicking_m_idx == 0) {
            if ((((bVar6 & 1) != 0) && (pcVar5 != (char *)0x0 && obj->known != (object *)0x0)) &&
               (_Var4 = ignore_item_ok(player,obj), !_Var4)) {
              msgt(0x21,"The %s %s!",local_88,pcVar5);
            }
            _Var4 = loc_eq(grid,player->grid);
            if (_Var4) {
              cmd_disable_repeat_floor_item();
            }
            square_delete_object(cave,(loc)grid,obj,true,true);
          }
          else if ((bVar6 & 1) != 0) {
            mon = (monster_conflict *)cave_monster(cave,(int)obj->mimicking_m_idx);
            become_aware((chunk *)c,mon);
          }
        }
        else if (((bVar6 & 1) != 0) &&
                ((obj->known != (object *)0x0 && (_Var4 = ignore_item_ok(player,obj), !_Var4)))) {
          pcVar5 = "are";
          if (obj->number == '\x01') {
            pcVar5 = "is";
          }
          msg("The %s %s unaffected!",local_88,pcVar5);
        }
      }
      local_c8.obvious = (_Bool)bVar6;
      obj = poVar2;
    } while (poVar2 != (object *)0x0);
  }
  return (_Bool)(local_c8.obvious & 1);
}

Assistant:

bool project_o(struct source origin, int r, struct loc grid, int dam, int typ,
			   const struct object *protected_obj)
{
	struct object *obj = square_object(cave, grid);
	bool obvious = false;

	/* Scan all objects in the grid */
	while (obj) {
		bool ignore = false;
		bool do_kill = false;
		const char *note_kill = NULL;
		struct object *next = obj->next;

		project_object_handler_f object_handler = object_handlers[typ];
		project_object_handler_context_t context = {
			origin,
			r,
			grid,
			dam,
			typ,
			obj,
			obvious,
			do_kill,
			ignore,
			note_kill,
		};

		if (object_handler != NULL)
			object_handler(&context);

		obvious = context.obvious;
		do_kill = context.do_kill && (obj != protected_obj);
		ignore = context.ignore;
		note_kill = context.note_kill;

		/* Attempt to destroy the object */
		if (do_kill) {
			char o_name[80];

			/* Effect observed */
			if (obj->known && !ignore_item_ok(player, obj) &&
				square_isseen(cave, grid)) {
				obvious = true;
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_BASE, player);
			}

			/* Artifacts, and other objects, get to resist */
			if (obj->artifact || ignore) {
				/* Observe the resist */
				if (obvious && obj->known
						&& !ignore_item_ok(player, obj)) {
					msg("The %s %s unaffected!", o_name,
						VERB_AGREEMENT(obj->number, "is", "are"));
				}
			} else if (obj->mimicking_m_idx) {
				/* Reveal mimics */
				if (obvious)
					become_aware(cave, cave_monster(
						cave, obj->mimicking_m_idx));
			} else {
				/* Describe if needed */
				if (obvious && obj->known && note_kill
						&& !ignore_item_ok(player, obj)) {
					msgt(MSG_DESTROY, "The %s %s!", o_name, note_kill);
				}

				/* Prevent command repetition, if necessary. */
				if (loc_eq(grid, player->grid)) {
					cmd_disable_repeat_floor_item();
				}

				/* Delete the object */
				square_delete_object(cave, grid, obj, true, true);
			}
		}

		/* Next object */
		obj = next;
	}

	/* Return "Anything seen?" */
	return (obvious);
}